

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

int get_charset_map(char *ct,vm_val_t *cs)

{
  int iVar1;
  uint uVar2;
  vm_obj_id_t vVar3;
  CCharmapToUni *pCVar4;
  size_t cnamelen;
  char *cname;
  size_t local_28;
  char *local_20;
  
  cs->typ = VM_NIL;
  (cs->val).obj = 0;
  if (ct == (char *)0x0) {
    return 3;
  }
  if ((ct[4] != '/' || *(int *)ct != 0x74786574) &&
     (iVar1 = bcmp(ct,"application/x-www-form-urlencoded",0x21), iVar1 != 0)) {
    return 3;
  }
  iVar1 = parse_attr_token(ct,"charset",&local_20,&local_28);
  if (iVar1 == 0) {
    if (cs->typ == VM_NIL) goto LAB_00203cd5;
    uVar2 = (cs->val).obj;
  }
  else {
    uVar2 = CVmObjCharSet::create(0,local_20,local_28);
    cs->typ = VM_OBJ;
    (cs->val).obj = uVar2;
  }
  pCVar4 = CVmObjCharSet::get_to_uni
                     ((CVmObjCharSet *)
                      ((long)&G_obj_table_X.pages_[uVar2 >> 0xc]->ptr_ +
                      (ulong)((uVar2 & 0xfff) * 0x18)));
  if (pCVar4 != (CCharmapToUni *)0x0) {
    return 1;
  }
LAB_00203cd5:
  vVar3 = CVmObjCharSet::create(0,"us-ascii",8);
  cs->typ = VM_OBJ;
  (cs->val).obj = vVar3;
  return 1;
}

Assistant:

void CVmObjHTTPRequest::reload_from_image(VMG_ vm_obj_id_t self,
                                          const char *ptr, size_t siz)
{
    /* load our image data */
    load_image_data(vmg_ ptr, siz);
}